

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitMessageSendNode
          (MethodSemanticAnalysis *this,MessageSendNode *node)

{
  pointer ppNVar1;
  bool bVar2;
  int iVar3;
  CompilerOptimizedSelector selectorId;
  Node *pNVar4;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *pvVar5;
  pointer ppMVar6;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar7;
  Oop selector;
  uint uVar8;
  MessageSendNode *this_00;
  Node **arg;
  pointer ppNVar9;
  
  pNVar4 = AST::MessageSendNode::getReceiver(node);
  iVar3 = (*pNVar4->_vptr_Node[7])(pNVar4);
  pvVar5 = AST::MessageSendNode::getChainedMessages(node);
  if (((char)iVar3 == '\0') &&
     ((pvVar5->
      super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (pvVar5->
      super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    selector = AST::MessageSendNode::getSelectorOop(node);
    selectorId = VMContext::getCompilerOptimizedSelectorId
                           ((this->super_ScopedInterpreter).context,selector);
    if ((selectorId != Invalid) && (bVar2 = optimizeMessage(this,node,selectorId), bVar2))
    goto LAB_001372ce;
  }
  pNVar4 = AST::MessageSendNode::getReceiver(node);
  (*pNVar4->_vptr_Node[2])(pNVar4,this);
  ppMVar6 = (pvVar5->
            super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(pvVar5->
                     super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6) >> 0x22 & 1) == 0)
  {
    uVar8 = 0xffffffff;
    do {
      this_00 = node;
      if (-1 < (int)uVar8) {
        this_00 = ppMVar6[uVar8];
      }
      pvVar7 = AST::MessageSendNode::getArguments(this_00);
      ppNVar1 = (pvVar7->
                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppNVar9 = (pvVar7->
                     super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppNVar9 != ppNVar1;
          ppNVar9 = ppNVar9 + 1) {
        (*(*ppNVar9)->_vptr_Node[2])(*ppNVar9,this);
      }
      uVar8 = uVar8 + 1;
      ppMVar6 = (pvVar5->
                super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while ((int)uVar8 <
             (int)((ulong)((long)(pvVar5->
                                 super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6) >> 3))
    ;
  }
LAB_001372ce:
  return (Oop)&NilObject;
}

Assistant:

Oop MethodSemanticAnalysis::visitMessageSendNode(MessageSendNode *node)
{
    auto isSuperSend = node->getReceiver()->isSuperReference();

	// Visit the arguments in reverse order.
	auto &chained = node->getChainedMessages();

    // Only try to optimize some message when they aren't in a chain.
    if(!isSuperSend && chained.empty())
    {
        auto selector = node->getSelectorOop();

        // If this is an optimized message, implement inlined.
        auto optimizedSelector = context->getCompilerOptimizedSelectorId(selector);
        if(optimizedSelector != CompilerOptimizedSelector::Invalid)
        {
            if(optimizeMessage(node, optimizedSelector))
                return Oop();
        }
    }

    // Visit the receiver.
	node->getReceiver()->acceptVisitor(this);

	// Send each message in the chain
	for(int i = -1; i < (int)chained.size(); ++i)
	{
		auto message = i < 0 ? node : chained[i];

		// Visit the arguments.
		auto &arguments = message->getArguments();
		for(auto &arg : arguments)
			arg->acceptVisitor(this);
	}

	return Oop();
}